

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

bool __thiscall
ON_MeshSeparateNgonInfo::TestNgonVertex(ON_MeshSeparateNgonInfo *this,uint *vertex_index_ptr)

{
  uint uVar1;
  uint *puVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  uint **ppuVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint *puVar10;
  
  if (vertex_index_ptr == (uint *)0x0) {
    bVar3 = 0;
  }
  else {
    uVar9 = *vertex_index_ptr;
    this->m_vi = uVar9;
    bVar3 = 1;
    if ((uVar9 < this->m_vertex_count0) &&
       (uVar7 = this->m_ngon_vmap[uVar9], this->m_ngon_vmark != uVar7)) {
      if ((this->m_vertex_count1 <= uVar7) && (uVar7 < this->m_vertex_count2)) {
        bVar4 = AddVertexIndexRef(this,vertex_index_ptr,uVar7);
        return bVar4;
      }
      ppuVar6 = this->m_vertex_face_map;
      puVar10 = ppuVar6[uVar9];
      if (puVar10 == (uint *)0x0) {
        puVar10 = (uint *)0x0;
        uVar9 = 0;
      }
      else {
        uVar9 = *puVar10;
        puVar10 = puVar10 + 1;
      }
      if (uVar9 != 0) {
        uVar8 = 0;
        bVar4 = true;
        do {
          uVar7 = puVar10[uVar8];
          if (((this->m_fi == uVar7) || (this->m_face_count <= uVar7)) ||
             (this->m_ni == this->m_ngondex_from_facedex_map[uVar7])) {
            uVar7 = 1;
          }
          else {
            bVar5 = AddVertexIndexRef(this,vertex_index_ptr,this->m_vertex_count2);
            uVar7 = 0;
            ppuVar6 = (uint **)0x0;
            if (bVar5) {
              this->m_ngon_vmap[this->m_vi] = this->m_vertex_count2;
              this->m_vertex_count2 = this->m_vertex_count2 + 1;
              puVar2 = this->m_ngondex_from_facedex_map;
              uVar8 = 0;
              do {
                uVar1 = puVar10[uVar8];
                if ((this->m_fi != uVar1) &&
                   ((this->m_face_count <= uVar1 || (this->m_ni != puVar2[uVar1])))) {
                  if (uVar7 < uVar8) {
                    puVar10[uVar7] = uVar1;
                  }
                  uVar7 = uVar7 + 1;
                }
                uVar8 = uVar8 + 1;
              } while (uVar9 != uVar8);
              puVar10[-1] = uVar7;
              ppuVar6 = (uint **)0x1;
              uVar7 = 0;
            }
          }
          bVar3 = (byte)ppuVar6;
          if ((char)uVar7 == '\0') break;
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
          bVar4 = uVar7 < uVar9;
        } while (bVar4);
        if (bVar4) goto LAB_005314a3;
      }
      this->m_ngon_vmap[this->m_vi] = this->m_ngon_vmark;
      bVar3 = 1;
    }
  }
LAB_005314a3:
  return (bool)(bVar3 & 1);
}

Assistant:

bool ON_MeshSeparateNgonInfo::TestNgonVertex(
  const unsigned int* vertex_index_ptr
  )
{
  if ( 0 == vertex_index_ptr )
    return false;
  m_vi = *vertex_index_ptr;
  if ( m_vi >= m_vertex_count0 )
  {
    // The source of this vertex index contained a bogus value.
    return true;
  }

  const unsigned int n = m_ngon_vmap[m_vi];
  
  if ( m_ngon_vmark == n )
  {
    // This vertex is known to be referenced only
    // by this ngon and does not need to be tested
    // or duplicated.
    return true;
  }

  if ( m_vertex_count1 <= n && n < m_vertex_count2 )
  {
    // this vertex is flagged for duplication in this ngon.
    return AddVertexIndexRef(vertex_index_ptr,n);
  }

  unsigned int* vfm = m_vertex_face_map[m_vi];
  const unsigned int vfm_count0 = (0 != vfm) ? *vfm++ : 0;
  if ( vfm_count0 > 0 )
  {
    for ( unsigned int vfmi = 0; vfmi < vfm_count0; vfmi++ )
    {
      unsigned int vfi = vfm[vfmi];
      if( m_fi == vfi )
        continue;
      if ( vfi >= m_face_count )
        continue;
      if ( m_ni == m_ngondex_from_facedex_map[vfi] )
        continue; // face[vfi] is in this ngon

      // this vertex is shared by a face not belonging to this ngon.
      if ( false == AddVertexIndexRef(vertex_index_ptr,m_vertex_count2) )
        return false;
      m_ngon_vmap[m_vi] = m_vertex_count2;
      m_vertex_count2++;

      // Any faces in this ngon that reference vertex m_vi
      // will be modified to reference vertex m_vertex_count2.
      // These faces need to be removed from vfm[], so
      // future searches for faces that share vertex m_vi
      // will be correct.
      unsigned int vfm_count1 = 0;
      for ( vfmi = 0; vfmi < vfm_count0; vfmi++ )
      {
        unsigned int vfi_local = vfm[vfmi];
        if( m_fi == vfi_local )
          continue;
        if ( vfi_local < m_face_count && m_ni == m_ngondex_from_facedex_map[vfi_local] )
          continue; // face[vfi_local] is in this ngon
        if ( vfmi > vfm_count1 )
          vfm[vfm_count1] = vfi_local;
        vfm_count1++;
      }
      vfm[-1] = vfm_count1;
      return true;
    }
  }

  // vertex is not shared
  m_ngon_vmap[m_vi] = m_ngon_vmark;
  return true;
}